

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O1

void R_ClearPastViewer(AActor *actor)

{
  ulong uVar1;
  long lVar2;
  
  if (InterpolationPath.Count != 0) {
    InterpolationPath.Count = 0;
  }
  if (PastViewers.Count != 0) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      if (*(AActor **)((long)&(PastViewers.Array)->ViewActor + lVar2) == actor) {
        TArray<InterpolationViewer,_InterpolationViewer>::Pop
                  (&PastViewers,
                   (InterpolationViewer *)((long)&(PastViewers.Array)->ViewActor + lVar2));
      }
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 0x80;
    } while (uVar1 < PastViewers.Count);
  }
  return;
}

Assistant:

void R_ClearPastViewer (AActor *actor)
{
	InterpolationPath.Clear();
	for (unsigned int i = 0; i < PastViewers.Size(); ++i)
	{
		if (PastViewers[i].ViewActor == actor)
		{
			// Found it, so remove it.
			if (i == PastViewers.Size())
			{
				PastViewers.Delete (i);
			}
			else
			{
				PastViewers.Pop (PastViewers[i]);
			}
		}
	}
}